

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboApiTest.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::FboApiTestGroup::init(FboApiTestGroup *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  ContextInfo *pCVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  RenderContext *pRVar5;
  FboApiCase *pFVar6;
  TestFunc local_1c0;
  TestFunc local_1a8;
  TestFunc local_170;
  _Self local_c8;
  allocator<char> local_b9;
  key_type local_b8;
  _Self local_98;
  byte local_8a;
  byte local_89;
  undefined1 auStack_88 [6];
  bool hasRenderToMipmap;
  bool defaultFboIsZero;
  _Iter local_80;
  _Base_ptr local_78;
  insert_iterator<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  undefined1 local_40 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  FboApiTestGroup *this_local;
  
  extensions._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_40);
  pCVar3 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  pvVar4 = glu::ContextInfo::getExtensions_abi_cxx11_(pCVar3);
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(pvVar4);
  pCVar3 = gles2::Context::getContextInfo((this->super_TestCaseGroup).m_context);
  pvVar4 = glu::ContextInfo::getExtensions_abi_cxx11_(pCVar3);
  local_60._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(pvVar4);
  local_78 = (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
  local_70 = std::
             inserter<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                       ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_40,(iterator)local_78);
  _auStack_88 = std::
                copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::insert_iterator<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>
                          (local_48,local_60,local_70);
  pRVar5 = gles2::Context::getRenderContext((this->super_TestCaseGroup).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[6])();
  local_89 = iVar2 == 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"GL_OES_fbo_render_mipmap",&local_b9);
  local_98._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_40,&local_b8);
  local_c8._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40);
  bVar1 = std::operator!=(&local_98,&local_c8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_8a = bVar1;
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"valid_tex2d_attachments",
             "Valid 2D texture attachments",validTex2DAttachmentsTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"valid_texcube_attachments",
             "Valid cubemap attachments",validTexCubeAttachmentsTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"valid_rbo_attachments",
             "Valid renderbuffer attachments",validRboAttachmentsTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  if ((local_89 & 1) == 0) {
    local_170 = notSupportedTest;
  }
  else {
    local_170 = attachToDefaultFramebufferTest;
  }
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"attach_to_default_fbo",
             "Invalid usage: attaching to default FBO",local_170);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"invalid_tex2d_attachments",
             "Invalid 2D texture attachments",invalidTex2DAttachmentTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"invalid_texcube_attachments",
             "Invalid cubemap attachments",invalidTexCubeAttachmentTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"invalid_rbo_attachments",
             "Invalid renderbuffer attachments",invalidRboAttachmentTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"attach_names",
             "Attach allocated names without objects",attachNamesTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  if ((local_8a & 1) == 0) {
    local_1a8 = textureLevelsTest;
  }
  else {
    local_1a8 = textureLevelsWithRenderToMipmapTest;
  }
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"texture_levels",
             "Valid and invalid texturel levels",local_1a8);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  if ((local_89 & 1) == 0) {
    local_1c0 = notSupportedTest;
  }
  else {
    local_1c0 = attachmentQueryDefaultFboTest;
  }
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"attachment_query_default_fbo",
             "Query attachments from default FBO",local_1c0);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"attachment_query_empty_fbo",
             "Query attachments from empty FBO",attachmentQueryEmptyFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"attachment_query_tex2d",
             "Query 2d texture attachment properties",attachmentQueryTex2DTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"attachment_query_texcube",
             "Query cubemap attachment properties",attachmentQueryTexCubeTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"attachment_query_rbo",
             "Query renderbuffer attachment properties",attachmentQueryRboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"delete_tex_2d_attached_to_bound_fbo",
             "Delete 2d texture attached to currently bound FBO",deleteTex2DAttachedToBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"delete_tex_cube_attached_to_bound_fbo",
             "Delete cubemap attached to currently bound FBO",deleteTexCubeAttachedToBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"delete_rbo_attached_to_bound_fbo",
             "Delete renderbuffer attached to currently bound FBO",deleteRboAttachedToBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"delete_tex_2d_attached_to_not_bound_fbo",
             "Delete 2d texture attached to FBO",deleteTex2DAttachedToNotBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,
             "delete_tex_cube_attached_to_not_bound_fbo","Delete cubemap attached to FBO",
             deleteTexCubeAttachedToNotBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  pFVar6 = (FboApiCase *)operator_new(0x80);
  FboApiCase::FboApiCase
            (pFVar6,(this->super_TestCaseGroup).m_context,"delete_rbo_attached_to_not_bound_fbo",
             "Delete renderbuffer attached to FBO",deleteRboAttachedToNotBoundFboTest);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pFVar6);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_40);
  return extraout_EAX;
}

Assistant:

void FboApiTestGroup::init (void)
{
	std::set<std::string> extensions;
	std::copy(m_context.getContextInfo().getExtensions().begin(), m_context.getContextInfo().getExtensions().end(), std::inserter(extensions, extensions.begin()));

	bool	defaultFboIsZero	= m_context.getRenderContext().getDefaultFramebuffer() == 0;
	bool	hasRenderToMipmap	= extensions.find("GL_OES_fbo_render_mipmap") != extensions.end();

	// Valid attachments
	addChild(new FboApiCase(m_context, "valid_tex2d_attachments",					"Valid 2D texture attachments",							validTex2DAttachmentsTest));
	addChild(new FboApiCase(m_context, "valid_texcube_attachments",					"Valid cubemap attachments",							validTexCubeAttachmentsTest));
	addChild(new FboApiCase(m_context, "valid_rbo_attachments",						"Valid renderbuffer attachments",						validRboAttachmentsTest));

	// Invalid attachments
	addChild(new FboApiCase(m_context, "attach_to_default_fbo",						"Invalid usage: attaching to default FBO",				defaultFboIsZero ? attachToDefaultFramebufferTest : notSupportedTest));
	addChild(new FboApiCase(m_context, "invalid_tex2d_attachments",					"Invalid 2D texture attachments",						invalidTex2DAttachmentTest));
	addChild(new FboApiCase(m_context, "invalid_texcube_attachments",				"Invalid cubemap attachments",							invalidTexCubeAttachmentTest));
	addChild(new FboApiCase(m_context, "invalid_rbo_attachments",					"Invalid renderbuffer attachments",						invalidRboAttachmentTest));
	addChild(new FboApiCase(m_context, "attach_names",								"Attach allocated names without objects",				attachNamesTest));

	addChild(new FboApiCase(m_context, "texture_levels",							"Valid and invalid texturel levels",					hasRenderToMipmap ? textureLevelsWithRenderToMipmapTest : textureLevelsTest));

	// Attachment queries
	addChild(new FboApiCase(m_context, "attachment_query_default_fbo",				"Query attachments from default FBO",					defaultFboIsZero ? attachmentQueryDefaultFboTest : notSupportedTest));
	addChild(new FboApiCase(m_context, "attachment_query_empty_fbo",				"Query attachments from empty FBO",						attachmentQueryEmptyFboTest));
	addChild(new FboApiCase(m_context, "attachment_query_tex2d",					"Query 2d texture attachment properties",				attachmentQueryTex2DTest));
	addChild(new FboApiCase(m_context, "attachment_query_texcube",					"Query cubemap attachment properties",					attachmentQueryTexCubeTest));
	addChild(new FboApiCase(m_context, "attachment_query_rbo",						"Query renderbuffer attachment properties",				attachmentQueryRboTest));

	// Delete attachments
	addChild(new FboApiCase(m_context, "delete_tex_2d_attached_to_bound_fbo",		"Delete 2d texture attached to currently bound FBO",	deleteTex2DAttachedToBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_tex_cube_attached_to_bound_fbo",		"Delete cubemap attached to currently bound FBO",		deleteTexCubeAttachedToBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_rbo_attached_to_bound_fbo",			"Delete renderbuffer attached to currently bound FBO",	deleteRboAttachedToBoundFboTest));

	addChild(new FboApiCase(m_context, "delete_tex_2d_attached_to_not_bound_fbo",	"Delete 2d texture attached to FBO",					deleteTex2DAttachedToNotBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_tex_cube_attached_to_not_bound_fbo",	"Delete cubemap attached to FBO",						deleteTexCubeAttachedToNotBoundFboTest));
	addChild(new FboApiCase(m_context, "delete_rbo_attached_to_not_bound_fbo",		"Delete renderbuffer attached to FBO",					deleteRboAttachedToNotBoundFboTest));
}